

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokth.c
# Opt level: O2

void tokthadd(toktdef *toktab1,char *name,int namel,int typ,int val,int hash)

{
  short *psVar1;
  mcmcxdef *ctx;
  uint uVar2;
  _func_void_toktdef_ptr_char_ptr_int_int_int_int *p_Var3;
  short sVar4;
  long lVar5;
  ulong uVar6;
  
  if ((int)(uint)*(ushort *)&toktab1[0x3c].toktfsea < namel + 0x10) {
    if (0x7f < (ulong)*(uint *)&toktab1[0x2b].tokterr) {
      errsigf(toktab1->tokterr,"TADS",0x6d);
    }
    ctx = (mcmcxdef *)toktab1[1].toktfadd;
    mcmunlck(ctx,*(mcmon *)((long)&toktab1[0x2b].tokterr +
                           (ulong)*(uint *)&toktab1[0x2b].tokterr * 2 + 4));
    uVar2 = *(uint *)&toktab1[0x2b].tokterr;
    *(uint *)((long)&toktab1[0x31].toktfsea + (ulong)uVar2 * 4 + 4) =
         (uint)*(ushort *)((long)&toktab1[0x3c].toktfsea + 2);
    uVar2 = uVar2 + 1;
    *(uint *)&toktab1[0x2b].tokterr = uVar2;
    uVar6 = 0;
    p_Var3 = (_func_void_toktdef_ptr_char_ptr_int_int_int_int *)
             mcmalo0(ctx,0x1000,(mcmon *)((long)&toktab1[0x2b].tokterr + (ulong)uVar2 * 2 + 4),
                     0xffff,0);
    toktab1[0x3c].toktfadd = p_Var3;
    *(undefined4 *)&toktab1[0x3c].toktfsea = 0x1000;
  }
  else {
    p_Var3 = toktab1[0x3c].toktfadd;
    uVar6 = (ulong)*(ushort *)((long)&toktab1[0x3c].toktfsea + 2);
  }
  lVar5 = (long)hash;
  p_Var3 = p_Var3 + uVar6;
  *(_func_int_toktdef_ptr_char_ptr_int_int_toksdef_ptr **)p_Var3 = (&toktab1[1].toktfsea)[lVar5];
  *(undefined2 *)(&toktab1[1].toktfsea + lVar5) =
       *(undefined2 *)
        ((long)&toktab1[0x2b].tokterr + (ulong)*(uint *)&toktab1[0x2b].tokterr * 2 + 4);
  *(uint *)((long)&toktab1[1].toktfsea + lVar5 * 8 + 4) =
       (uint)*(ushort *)((long)&toktab1[0x3c].toktfsea + 2);
  *(short *)(p_Var3 + 10) = (short)val;
  p_Var3[0xe] = SUB41(namel,0);
  p_Var3[8] = SUB41(typ,0);
  p_Var3[9] = SUB41(hash,0);
  *(undefined2 *)(p_Var3 + 0xc) = 0;
  memcpy(p_Var3 + 0xf,name,(long)namel);
  uVar2 = namel + 0x17U & 0xfffffff8;
  sVar4 = 0;
  if ((int)uVar2 <= (int)(uint)*(ushort *)&toktab1[0x3c].toktfsea) {
    sVar4 = -(((ushort)(namel + 0x17U) & 0xfff8) - *(ushort *)&toktab1[0x3c].toktfsea);
  }
  psVar1 = (short *)((long)&toktab1[0x3c].toktfsea + 2);
  *psVar1 = *psVar1 + (short)uVar2;
  *(short *)&toktab1[0x3c].toktfsea = sVar4;
  return;
}

Assistant:

void tokthadd(toktdef *toktab1, char *name, int namel,
              int typ, int val, int hash)
{
    int       siz = sizeof(toksh1def) + namel;
    toksdef  *sym;
    tokshdef *symh;
    tokthdef *toktab = (tokthdef *)toktab1;
    
    if (toktab->tokthsize < siz)
    {
        mcmcxdef *mctx = toktab->tokthmem;
        
        /* insufficient space in current pool; add a new pool */
        if (toktab->tokthpcnt >= TOKPOOLMAX)
            errsig(toktab->tokthsc.tokterr, ERR_MANYSYM);

        /* unlock current pool page, and note its final size */
        mcmunlck(mctx, toktab->tokthpool[toktab->tokthpcnt]);
        toktab->tokthfinal[toktab->tokthpcnt] = toktab->tokthofs;

        /* allocate a new pool page, and leave it locked */
        toktab->tokthcpool = mcmalo(mctx, (ushort)TOKTHSIZE,
                                   &toktab->tokthpool[++(toktab->tokthpcnt)]);
        toktab->tokthsize = TOKTHSIZE;
        toktab->tokthofs = 0;
    }
    symh = (tokshdef *)(toktab->tokthcpool + toktab->tokthofs);
    sym = &symh->tokshsc;
    
    /* link into list for this hash value */
    OSCPYSTRUCT(symh->tokshnxt, toktab->tokthhsh[hash]);
    toktab->tokthhsh[hash].tokthpobj = toktab->tokthpool[toktab->tokthpcnt];
    toktab->tokthhsh[hash].tokthpofs = toktab->tokthofs;
    
    /* fill in rest of toksdef */
    sym->toksval = val;
    sym->tokslen = namel;
    sym->tokstyp = typ;
    sym->tokshsh = hash;
    sym->toksfr  = 0;
    memcpy(sym->toksnam, name, (size_t)namel);
    
    /* update free pool pointer */
    siz = osrndsz(siz);
    toktab->tokthofs += siz;
    if (siz > toktab->tokthsize) toktab->tokthsize = 0;
    else toktab->tokthsize -= siz;
}